

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeIntArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  byte *pbVar7;
  byte *buffer_00;
  ulong uVar8;
  ulong uVar9;
  int local_34 [2];
  int32 value;
  
  uVar1 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 <= (ulong)uVar1 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a4,
                                "(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength()"
                               );
    if (!bVar4) goto LAB_008967fb;
    *puVar6 = 0;
  }
  pbVar7 = ByteBlock::GetBuffer(deserializeInto);
  uVar1 = *(uint *)buffer;
  uVar9 = (ulong)*(uint *)(buffer + 5);
  *(uint *)(pbVar7 + uVar1) = *(uint *)(buffer + 5);
  uVar2 = *(uint *)buffer;
  uVar5 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar5 < (ulong)uVar2 + uVar9 * 4 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a8,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar4) {
LAB_008967fb:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  buffer_00 = buffer + 9;
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      buffer_00 = ReadConstantSizedInt32
                            (buffer_00,
                             (size_t)(this->raw + ((long)this->totalSize - (long)buffer_00)),
                             local_34);
      *(int *)(pbVar7 + uVar8 * 4 + (ulong)uVar1 + 4) = local_34[0];
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  return buffer_00;
}

Assistant:

const byte * DeserializeIntArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedIntArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxIntArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength());
        auto result = (AuxArray<int> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->intCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            int32 value;
            current = ReadConstantSizedInt32(current, &value);
            result->elements[index] = value;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxIntArray);
#endif
        return current;
    }